

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O0

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::DumpFixedFields
          (DictionaryTypeHandlerBase<unsigned_short> *this)

{
  undefined4 uVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *pBVar6;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar7;
  PropertyRecord **ppPVar8;
  char16 *pcVar9;
  PropertyRecord *propertyRecord;
  DictionaryPropertyDescriptor<unsigned_short> descriptor;
  int i;
  DictionaryTypeHandlerBase<unsigned_short> *this_local;
  
  descriptor.flags = None;
  descriptor.Attributes = '\0';
  descriptor.Data = 0;
  unique0x10000141 = this;
  while( true ) {
    uVar1 = descriptor._0_4_;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    iVar5 = JsUtil::
            BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::Count(pBVar6);
    if (iVar5 <= (int)uVar1) break;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    pDVar7 = JsUtil::
             BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             ::GetValueAt(pBVar6,descriptor._0_4_);
    unique0x00012000 = *pDVar7;
    pBVar6 = Memory::
             WriteBarrierPtr<JsUtil::BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
             ::operator->(&this->propertyMap);
    ppPVar8 = JsUtil::
              BaseDictionary<const_Js::PropertyRecord_*,_Js::DictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
              ::GetKeyAt(pBVar6,descriptor._0_4_);
    pcVar9 = PropertyRecord::GetBuffer(*ppPVar8);
    bVar2 = DictionaryPropertyDescriptor<unsigned_short>::GetIsInitialized
                      ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&propertyRecord + 4));
    bVar3 = DictionaryPropertyDescriptor<unsigned_short>::GetIsFixed
                      ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&propertyRecord + 4));
    bVar4 = DictionaryPropertyDescriptor<unsigned_short>::GetUsedAsFixed
                      ((DictionaryPropertyDescriptor<unsigned_short> *)((long)&propertyRecord + 4));
    Output::Print(L" %s %d%d%d,",pcVar9,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4);
    descriptor._0_4_ = descriptor._0_4_ + 1;
  }
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::DumpFixedFields() const {
        for (int i = 0; i < propertyMap->Count(); i++)
        {
            DictionaryPropertyDescriptor<T> descriptor = propertyMap->GetValueAt(i);

            const PropertyRecord* propertyRecord = propertyMap->GetKeyAt(i);
            Output::Print(_u(" %s %d%d%d,"), propertyRecord->GetBuffer(),
                descriptor.GetIsInitialized() ? 1 : 0,
                descriptor.GetIsFixed() ? 1 : 0,
                descriptor.GetUsedAsFixed() ? 1 : 0);
        }
    }